

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap2_char_next(TT_CMap cmap,FT_UInt32 *pcharcode)

{
  FT_Byte *table_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FT_Byte *pFVar4;
  uint local_58;
  FT_UInt idx;
  FT_UInt pos;
  FT_UInt char_lo;
  FT_UInt offset;
  FT_Int delta;
  FT_UInt count;
  FT_UInt start;
  FT_Byte *p;
  FT_Byte *subheader;
  FT_UInt32 local_28;
  FT_UInt32 charcode;
  FT_UInt32 result;
  FT_UInt gindex;
  FT_Byte *table;
  FT_UInt32 *pcharcode_local;
  TT_CMap cmap_local;
  
  table_00 = cmap->data;
  charcode = 0;
  local_28 = 0;
  subheader._4_4_ = *pcharcode + 1;
LAB_00326566:
  if (0xffff < subheader._4_4_) {
LAB_00326784:
    *pcharcode = local_28;
    return charcode;
  }
  pFVar4 = tt_cmap2_get_subheader(table_00,subheader._4_4_);
  if (pFVar4 != (FT_Byte *)0x0) {
    uVar1 = (uint)CONCAT11(*pFVar4,pFVar4[1]);
    uVar2 = (uint)CONCAT11(pFVar4[2],pFVar4[3]);
    uVar3 = (uint)CONCAT11(pFVar4[6],pFVar4[7]);
    idx = subheader._4_4_ & 0xff;
    if ((uVar1 + uVar2 <= idx) && (subheader._4_4_ < 0x100)) {
      subheader._4_4_ = 0x100;
      goto LAB_00326566;
    }
    if (uVar3 == 0) {
      if (subheader._4_4_ != 0x100) goto LAB_00326759;
      goto LAB_00326784;
    }
    if (idx < uVar1) {
      local_58 = 0;
      idx = uVar1;
    }
    else {
      local_58 = idx - uVar1;
    }
    subheader._4_4_ = (subheader._4_4_ & 0xffffff00) + idx;
    _count = pFVar4 + 6 + (uVar3 + local_58 * 2);
    for (; local_58 < uVar2; local_58 = local_58 + 1) {
      if ((CONCAT11(*_count,_count[1]) != 0) &&
         (charcode = (FT_UInt32)
                     (ushort)(CONCAT11(*_count,_count[1]) + CONCAT11(pFVar4[4],pFVar4[5])),
         charcode != 0)) {
        local_28 = subheader._4_4_;
        goto LAB_00326784;
      }
      subheader._4_4_ = subheader._4_4_ + 1;
      _count = _count + 2;
    }
    if (uVar2 != 0) {
      subheader._4_4_ = subheader._4_4_ - 1;
    }
  }
LAB_00326759:
  if (subheader._4_4_ < 0x100) {
    subheader._4_4_ = subheader._4_4_ + 1;
  }
  else {
    subheader._4_4_ = (subheader._4_4_ & 0xffffff00) + 0x100;
  }
  goto LAB_00326566;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap2_char_next( TT_CMap     cmap,
                      FT_UInt32  *pcharcode )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt    gindex   = 0;
    FT_UInt32  result   = 0;
    FT_UInt32  charcode = *pcharcode + 1;
    FT_Byte*   subheader;


    while ( charcode < 0x10000UL )
    {
      subheader = tt_cmap2_get_subheader( table, charcode );
      if ( subheader )
      {
        FT_Byte*  p       = subheader;
        FT_UInt   start   = TT_NEXT_USHORT( p );
        FT_UInt   count   = TT_NEXT_USHORT( p );
        FT_Int    delta   = TT_NEXT_SHORT ( p );
        FT_UInt   offset  = TT_PEEK_USHORT( p );
        FT_UInt   char_lo = (FT_UInt)( charcode & 0xFF );
        FT_UInt   pos, idx;


        if ( char_lo >= start + count && charcode <= 0xFF )
        {
          /* this happens only for a malformed cmap */
          charcode = 0x100;
          continue;
        }

        if ( offset == 0 )
        {
          if ( charcode == 0x100 )
            goto Exit; /* this happens only for a malformed cmap */
          goto Next_SubHeader;
        }

        if ( char_lo < start )
        {
          char_lo = start;
          pos     = 0;
        }
        else
          pos = (FT_UInt)( char_lo - start );

        p       += offset + pos * 2;
        charcode = FT_PAD_FLOOR( charcode, 256 ) + char_lo;

        for ( ; pos < count; pos++, charcode++ )
        {
          idx = TT_NEXT_USHORT( p );

          if ( idx != 0 )
          {
            gindex = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
            if ( gindex != 0 )
            {
              result = charcode;
              goto Exit;
            }
          }
        }

        /* if unsuccessful, avoid `charcode' leaving */
        /* the current 256-character block           */
        if ( count )
          charcode--;
      }

      /* If `charcode' is <= 0xFF, retry with `charcode + 1'.      */
      /* Otherwise jump to the next 256-character block and retry. */
    Next_SubHeader:
      if ( charcode <= 0xFF )
        charcode++;
      else
        charcode = FT_PAD_FLOOR( charcode, 0x100 ) + 0x100;
    }

  Exit:
    *pcharcode = result;

    return gindex;
  }